

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O1

Expected<llvm::DWARFDebugLoc::LocationList> * __thiscall
llvm::DWARFDebugLoc::parseOneLocationList
          (Expected<llvm::DWARFDebugLoc::LocationList> *__return_storage_ptr__,DWARFDebugLoc *this,
          DWARFDataExtractor *Data,uint64_t *Offset)

{
  uint *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint16_t uVar4;
  LocationList LL;
  undefined1 local_78 [8];
  Entry E;
  undefined1 local_40 [8];
  Cursor C;
  
  LL.Offset = (uint64_t)
              &LL.Entries.super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>.
               super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
               super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
               super_SmallVectorBase.Size;
  LL.Entries.super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>.
  super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
  super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.BeginX =
       (void *)0x200000000;
  uVar2 = *Offset;
  this->AddressSize = (uint)(Data->super_DataExtractor).AddressSize;
  C.Offset = 1;
  puVar1 = &E.Loc.super_SmallVectorImpl<unsigned_char>.
            super_SmallVectorTemplateBase<unsigned_char,_true>.
            super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size;
  LL.Entries.super_SmallVectorStorage<llvm::DWARFDebugLoc::Entry,_2U>.InlineElts[1].buffer._32_8_ =
       Offset;
  local_40 = (undefined1  [8])uVar2;
  do {
    E.Loc.super_SmallVectorImpl<unsigned_char>.super_SmallVectorTemplateBase<unsigned_char,_true>.
    super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX =
         (void *)0x400000000;
    E.End = (uint64_t)puVar1;
    local_78 = (undefined1  [8])
               DWARFDataExtractor::getRelocatedValue
                         (Data,(uint)(Data->super_DataExtractor).AddressSize,(uint64_t *)local_40,
                          (uint64_t *)0x0,(Error *)&C);
    E.Begin = DWARFDataExtractor::getRelocatedValue
                        (Data,(uint)(Data->super_DataExtractor).AddressSize,(uint64_t *)local_40,
                         (uint64_t *)0x0,(Error *)&C);
    uVar3 = C.Offset;
    C.Offset = 0;
    if (1 < uVar3) {
      E.Loc._16_8_ = uVar3 | 1;
      Expected<llvm::DWARFDebugLoc::LocationList>::Expected
                (__return_storage_ptr__,(Error *)&E.Loc.super_SmallVectorStorage<unsigned_char,_4U>)
      ;
      if ((long *)(E.Loc._16_8_ & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)(E.Loc._16_8_ & 0xfffffffffffffffe) + 8))();
      }
LAB_00d807f8:
      if ((uint *)E.End != puVar1) {
        free((void *)E.End);
      }
      if ((long *)(C.Offset & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)(C.Offset & 0xfffffffffffffffe) + 8))();
      }
      SmallVector<llvm::DWARFDebugLoc::Entry,_2U>::~SmallVector
                ((SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *)&LL);
      return __return_storage_ptr__;
    }
    if (E.Begin == 0 && local_78 == (undefined1  [8])0x0) {
      *(undefined1 (*) [8])
       LL.Entries.super_SmallVectorStorage<llvm::DWARFDebugLoc::Entry,_2U>.InlineElts[1].buffer.
       _32_8_ = local_40;
      __return_storage_ptr__->field_0x68 = __return_storage_ptr__->field_0x68 & 0xfe;
      *(uint64_t *)(__return_storage_ptr__->field_0).ErrorStorage.buffer = uVar2;
      SmallVector<llvm::DWARFDebugLoc::Entry,_2U>::SmallVector
                ((SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *)
                 ((long)&__return_storage_ptr__->field_0 + 8),
                 (SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *)&LL);
      goto LAB_00d807f8;
    }
    if (local_78 != (undefined1  [8])(-(ulong)(this->AddressSize != 4) | 0xffffffff)) {
      uVar4 = DataExtractor::getU16(&Data->super_DataExtractor,(uint64_t *)local_40,(Error *)&C);
      DataExtractor::getU8
                (&Data->super_DataExtractor,(Cursor *)local_40,
                 (SmallVectorImpl<unsigned_char> *)&E.End,(uint)uVar4);
    }
    SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>::push_back
              ((SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false> *)&LL,(Entry *)local_78);
    if ((uint *)E.End != puVar1) {
      free((void *)E.End);
    }
  } while( true );
}

Assistant:

Expected<DWARFDebugLoc::LocationList>
DWARFDebugLoc::parseOneLocationList(const DWARFDataExtractor &Data,
                                    uint64_t *Offset) {
  LocationList LL;
  LL.Offset = *Offset;
  AddressSize = Data.getAddressSize();
  DataExtractor::Cursor C(*Offset);

  // 2.6.2 Location Lists
  // A location list entry consists of:
  while (true) {
    Entry E;

    // 1. A beginning address offset. ...
    E.Begin = Data.getRelocatedAddress(C);

    // 2. An ending address offset. ...
    E.End = Data.getRelocatedAddress(C);

    if (Error Err = C.takeError())
      return std::move(Err);

    // The end of any given location list is marked by an end of list entry,
    // which consists of a 0 for the beginning address offset and a 0 for the
    // ending address offset.
    if (E.Begin == 0 && E.End == 0) {
      *Offset = C.tell();
      return LL;
    }

    if (E.Begin != (AddressSize == 4 ? -1U : -1ULL)) {
      unsigned Bytes = Data.getU16(C);
      // A single location description describing the location of the object...
      Data.getU8(C, E.Loc, Bytes);
    }

    LL.Entries.push_back(std::move(E));
  }
}